

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_SetLineTrigger(FParser *this)

{
  uint uVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  maplinedef_t mld;
  FLineIdIterator itr;
  int iVar6;
  
  bVar2 = CheckArgs(this,2);
  if (bVar2) {
    uVar4 = intvalue(this->t_argv);
    iVar5 = intvalue(this->t_argv + 1);
    if (this->t_argc < 3) {
      sVar3 = 0;
    }
    else {
      iVar6 = intvalue(this->t_argv + 2);
      sVar3 = (short)iVar6;
    }
    itr.start = tagManager.IDHashFirst[uVar4 & 0xff];
    itr.searchtag = uVar4;
    while( true ) {
      uVar4 = FLineIdIterator::Next(&itr);
      if ((int)uVar4 < 0) break;
      mld.special = (short)iVar5;
      mld.flags = 0;
      uVar1 = lines[uVar4].flags;
      mld.tag = sVar3;
      P_TranslateLineDef((line_t *)(lines + uVar4),&mld,-1);
      lines[uVar4].flags = lines[uVar4].flags & 0x803e00 | uVar1 & 0xff7fc1ff;
    }
  }
  return;
}

Assistant:

void FParser::SF_SetLineTrigger()
{
	int i,id,spec,tag(0);

	if (CheckArgs(2))
	{
		id=intvalue(t_argv[0]);
		spec=intvalue(t_argv[1]);
		if (t_argc>2) tag=intvalue(t_argv[2]);
		FLineIdIterator itr(id);
		while ((i = itr.Next()) >= 0)
		{
			maplinedef_t mld;
			mld.special = spec;
			mld.tag = tag;
			mld.flags = 0;
			int f = lines[i].flags;
			P_TranslateLineDef(&lines[i], &mld);
			lines[i].flags = (lines[i].flags & (ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY)) |
				(f & ~(ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY));

		}
	}
}